

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O1

void __thiscall diffusion::NetReader::~NetReader(NetReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_0012bdc0;
  LOCK();
  (((this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  die_)._M_base._M_i = true;
  UNLOCK();
  std::thread::join();
  std::
  deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~deque(&(this->data_queue_).processed_data_queue_);
  pcVar2 = (this->data_queue_).unprocessed_data_._M_dataplus._M_p;
  paVar1 = &(this->data_queue_).unprocessed_data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->receiver_thread_)._M_id._M_thread == 0) {
    this_00 = (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

NetReader::~NetReader() {
    receiver_->shut_down();
    receiver_thread_.join();
}